

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O3

float set_side_length(mixed_channel_t set,vbap_data *data)

{
  float (*pafVar1) [3];
  float (*pafVar2) [3];
  byte bVar3;
  undefined3 in_register_00000039;
  uint uVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  
  uVar4 = CONCAT31(in_register_00000039,set);
  pafVar1 = data->speakers + data->sets[uVar4].speakers[0];
  bVar3 = data->sets[uVar4].speakers[1];
  pafVar2 = data->speakers + data->sets[uVar4].speakers[2];
  fVar5 = (*pafVar1)[0];
  fVar8 = (*pafVar1)[1];
  fVar10 = data->speakers[bVar3][0];
  fVar11 = data->speakers[bVar3][1];
  fVar13 = (*pafVar1)[2];
  fVar12 = data->speakers[bVar3][2];
  auVar14._0_4_ = fVar5 * fVar5 + fVar8 * fVar8;
  auVar14._4_4_ = fVar10 * fVar10 + fVar11 * fVar11;
  auVar14._8_8_ = 0;
  auVar15._4_4_ = fVar12 * fVar12 + auVar14._4_4_;
  auVar15._0_4_ = fVar13 * fVar13 + auVar14._0_4_;
  auVar15._8_8_ = 0;
  auVar15 = sqrtps(auVar14,auVar15);
  fVar10 = (fVar13 * fVar12 + fVar5 * fVar10 + fVar8 * fVar11) / (auVar15._4_4_ * auVar15._0_4_);
  if (fVar10 <= 1.0) {
    if (-1.0 <= fVar10) {
      dVar6 = acos((double)fVar10);
      fVar10 = ABS((float)dVar6);
      fVar5 = (*pafVar1)[0];
      fVar8 = (*pafVar1)[1];
      fVar13 = (*pafVar1)[2];
      auVar15 = ZEXT416((uint)SQRT(fVar13 * fVar13 + fVar5 * fVar5 + fVar8 * fVar8));
    }
    else {
      fVar10 = 3.1415927;
    }
  }
  else {
    fVar10 = 0.0;
  }
  fVar16 = 0.0;
  fVar11 = (*pafVar2)[0];
  fVar12 = (*pafVar2)[1];
  fVar7 = (*pafVar2)[2];
  fVar9 = SQRT(fVar7 * fVar7 + fVar11 * fVar11 + fVar12 * fVar12);
  fVar5 = (fVar13 * fVar7 + fVar5 * fVar11 + fVar8 * fVar12) / (auVar15._0_4_ * fVar9);
  if (fVar5 <= 1.0) {
    if (-1.0 <= fVar5) {
      dVar6 = acos((double)fVar5);
      fVar16 = ABS((float)dVar6);
      fVar11 = (*pafVar2)[0];
      fVar12 = (*pafVar2)[1];
      fVar7 = (*pafVar2)[2];
      fVar9 = SQRT(fVar7 * fVar7 + fVar11 * fVar11 + fVar12 * fVar12);
    }
    else {
      fVar16 = 3.1415927;
    }
  }
  fVar5 = data->speakers[bVar3][0];
  fVar8 = data->speakers[bVar3][1];
  fVar13 = data->speakers[bVar3][2];
  fVar8 = (fVar7 * fVar13 + fVar11 * fVar5 + fVar12 * fVar8) /
          (SQRT(fVar13 * fVar13 + fVar5 * fVar5 + fVar8 * fVar8) * fVar9);
  fVar5 = 0.0;
  if (fVar8 <= 1.0) {
    if (-1.0 <= fVar8) {
      dVar6 = acos((double)fVar8);
      fVar5 = ABS((float)dVar6);
    }
    else {
      fVar5 = 3.1415927;
    }
  }
  fVar5 = fVar10 + fVar16 + fVar5;
  if (fVar5 <= 1e-06) {
    return 0.0;
  }
  fVar8 = data->speakers[bVar3][0];
  fVar10 = data->speakers[bVar3][1];
  fVar13 = (*pafVar1)[0] * fVar10 - fVar8 * (*pafVar1)[1];
  fVar11 = data->speakers[bVar3][2];
  fVar10 = (*pafVar1)[1] * fVar11 - fVar10 * (*pafVar1)[2];
  fVar8 = (*pafVar1)[2] * fVar8 - fVar11 * (*pafVar1)[0];
  fVar11 = SQRT(fVar13 * fVar13 + fVar10 * fVar10 + fVar8 * fVar8);
  if (0.0 < fVar11) {
    fVar13 = fVar13 / fVar11;
    fVar8 = fVar8 / fVar11;
  }
  else {
    fVar13 = 0.0;
    fVar8 = 0.0;
  }
  return ABS(fVar13 * (*pafVar2)[2] +
             (float)(-(uint)(0.0 < fVar11) & (uint)(fVar10 / fVar11)) * (*pafVar2)[0] +
             fVar8 * (*pafVar2)[1]) / fVar5;
}

Assistant:

float set_side_length(mixed_channel_t set, struct vbap_data *data){
  float cross[3];
  float *i = data->speakers[data->sets[set].speakers[0]];
  float *j = data->speakers[data->sets[set].speakers[1]];
  float *k = data->speakers[data->sets[set].speakers[2]];
  float length = fabsf(vec_angle(i, j))
                 + fabsf(vec_angle(i, k))
                 + fabsf(vec_angle(j, k));
  vec_cross(cross, i, j);
  if(0.000001 < length) return fabsf(vec_dot(cross, k)) / length;
  return 0.0;
}